

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetGenericAliasTypeName(ExpressionContext *ctx,InplaceStr baseName)

{
  ExpressionContext *__src;
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  size_t sVar4;
  char *pos;
  char *name;
  uint nameLength;
  ExpressionContext *ctx_local;
  InplaceStr baseName_local;
  char *__s;
  
  baseName_local.begin = baseName.end;
  ctx_local = (ExpressionContext *)baseName.begin;
  uVar1 = InplaceStr::length((InplaceStr *)&ctx_local);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar1 + 2));
  __src = ctx_local;
  __s = (char *)CONCAT44(extraout_var,iVar2);
  *__s = '@';
  uVar3 = InplaceStr::length((InplaceStr *)&ctx_local);
  memcpy(__s + 1,__src,(ulong)uVar3);
  uVar3 = InplaceStr::length((InplaceStr *)&ctx_local);
  (__s + 1)[uVar3] = '\0';
  sVar4 = strlen(__s);
  if (sVar4 + 1 == (ulong)(uVar1 + 2)) {
    InplaceStr::InplaceStr((InplaceStr *)&baseName_local.end,__s);
    return stack0xffffffffffffffe8;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x16d,"InplaceStr GetGenericAliasTypeName(ExpressionContext &, InplaceStr)");
}

Assistant:

InplaceStr GetGenericAliasTypeName(ExpressionContext &ctx, InplaceStr baseName)
{
	unsigned nameLength = baseName.length() + 1 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '@';

	memcpy(pos, baseName.begin, baseName.length());
	pos += baseName.length();

	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}